

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dupcat.c
# Opt level: O0

char * dupcat_fn(char *s1,...)

{
  char in_AL;
  size_t sVar1;
  char *__dest;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_130;
  undefined8 *local_110;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  uint local_48;
  undefined4 local_44;
  va_list ap;
  char *sn;
  char *q;
  char *p;
  int len;
  char *s1_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_f0 = in_RSI;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  sVar1 = strlen(s1);
  p._4_4_ = (int)sVar1;
  ap[0].overflow_arg_area = local_f8;
  ap[0]._0_8_ = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 8;
  while( true ) {
    if (local_48 < 0x29) {
      local_110 = (undefined8 *)((long)(int)local_48 + (long)ap[0].overflow_arg_area);
      local_48 = local_48 + 8;
    }
    else {
      local_110 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    ap[0].reg_save_area = (void *)*local_110;
    if ((char *)ap[0].reg_save_area == (char *)0x0) break;
    sVar1 = strlen((char *)ap[0].reg_save_area);
    p._4_4_ = p._4_4_ + (int)sVar1;
  }
  __dest = (char *)safemalloc((long)(p._4_4_ + 1),1,0);
  strcpy(__dest,s1);
  sVar1 = strlen(__dest);
  sn = __dest + sVar1;
  ap[0].overflow_arg_area = local_f8;
  ap[0]._0_8_ = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 8;
  while( true ) {
    if (local_48 < 0x29) {
      local_130 = (undefined8 *)((long)(int)local_48 + (long)ap[0].overflow_arg_area);
      local_48 = local_48 + 8;
    }
    else {
      local_130 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    ap[0].reg_save_area = (void *)*local_130;
    if ((char *)ap[0].reg_save_area == (char *)0x0) break;
    strcpy(sn,(char *)ap[0].reg_save_area);
    sVar1 = strlen(sn);
    sn = sn + sVar1;
  }
  return __dest;
}

Assistant:

char *dupcat_fn(const char *s1, ...)
{
    int len;
    char *p, *q, *sn;
    va_list ap;

    len = strlen(s1);
    va_start(ap, s1);
    while (1) {
        sn = va_arg(ap, char *);
        if (!sn)
            break;
        len += strlen(sn);
    }
    va_end(ap);

    p = snewn(len + 1, char);
    strcpy(p, s1);
    q = p + strlen(p);

    va_start(ap, s1);
    while (1) {
        sn = va_arg(ap, char *);
        if (!sn)
            break;
        strcpy(q, sn);
        q += strlen(q);
    }
    va_end(ap);

    return p;
}